

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O0

void __thiscall Rml::DecoratorText::~DecoratorText(DecoratorText *this)

{
  DecoratorText *this_local;
  
  (this->super_Decorator)._vptr_Decorator = (_func_int **)&PTR__DecoratorText_00815ed8;
  ::std::__cxx11::string::~string((string *)&this->text);
  Decorator::~Decorator(&this->super_Decorator);
  return;
}

Assistant:

DecoratorText::~DecoratorText() {}